

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::ZoneVectorBase::_reserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  void *__dest;
  uint in_ECX;
  uint in_EDX;
  undefined8 *in_RDI;
  void *oldData;
  uint8_t *newData;
  size_t allocatedBytes;
  uint32_t nBytes;
  uint32_t oldCapacity;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  size_t *in_stack_ffffffffffffffc0;
  void *__src;
  size_t in_stack_ffffffffffffffc8;
  ZoneAllocator *in_stack_ffffffffffffffd0;
  Error local_4;
  
  if (*(uint *)((long)in_RDI + 0xc) < in_ECX) {
    if (in_ECX * in_EDX < in_ECX) {
      local_4 = DebugUtils::errored(1);
    }
    else {
      __dest = ZoneAllocator::alloc
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0);
      if (__dest == (void *)0x0) {
        local_4 = DebugUtils::errored(1);
      }
      else {
        __src = (void *)*in_RDI;
        if (*(int *)(in_RDI + 1) != 0) {
          memcpy(__dest,__src,(ulong)*(uint *)(in_RDI + 1) * (ulong)in_EDX);
        }
        if (__src != (void *)0x0) {
          ZoneAllocator::release(in_stack_ffffffffffffffd0,__dest,(size_t)__src);
        }
        *(int *)((long)in_RDI + 0xc) = (int)((ulong)in_stack_ffffffffffffffd0 / (ulong)in_EDX);
        if (*(uint *)((long)in_RDI + 0xc) < in_ECX) {
          DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
        }
        *in_RDI = __dest;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  uint32_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorOutOfMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(allocator->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  void* oldData = _data;
  if (_size)
    memcpy(newData, oldData, size_t(_size) * sizeOfT);

  if (oldData)
    allocator->release(oldData, size_t(oldCapacity) * sizeOfT);

  _capacity = uint32_t(allocatedBytes / sizeOfT);
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}